

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.h
# Opt level: O2

void __thiscall
arangodb::velocypack::HexDump::HexDump
          (HexDump *this,Slice slice,int valuesPerLine,string *separator,string *header)

{
  ValueLength VVar1;
  uint8_t *local_28;
  
  this->data = slice._start;
  local_28 = slice._start;
  VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                     &local_28);
  this->length = VVar1;
  this->valuesPerLine = valuesPerLine;
  std::__cxx11::string::string((string *)&this->separator,separator);
  std::__cxx11::string::string((string *)&this->header,header);
  return;
}

Assistant:

HexDump(Slice slice, int valuesPerLine = 16,
          std::string const& separator = " ", std::string const& header = "0x")
      : data(slice.start()),
        length(slice.byteSize()),
        valuesPerLine(valuesPerLine),
        separator(separator),
        header(header) {}